

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmByteArraySource::clone
          (CVmByteArraySource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  long unaff_retaddr;
  vm_obj_id_t vStack000000000000000c;
  undefined8 in_stack_00000008;
  CVmByteArraySource *in_stack_00000010;
  
  vStack000000000000000c = (vm_obj_id_t)((ulong)in_stack_00000008 >> 0x20);
  pvVar1 = operator_new(0x38);
  CVmByteArraySource(in_stack_00000010,vStack000000000000000c,unaff_retaddr,(long)this);
  return (int)pvVar1;
}

Assistant:

CVmDataSource *clone(VMG_ const char * /*mode*/)
    {
        return new CVmByteArraySource(
            vmg_ arr_id, start_idx, end_idx - start_idx);
    }